

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

void __thiscall PSBTOutput::FromSignatureData(PSBTOutput *this,SignatureData *sigdata)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  _Rb_tree_node_base *p_Var8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  vStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->redeem_script).super_CScriptBase._size;
  uVar7 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar7 = uVar1;
  }
  if (uVar7 == 0) {
    uVar1 = (sigdata->redeem_script).super_CScriptBase._size;
    uVar7 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar7 = uVar1;
    }
    if (uVar7 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,
                 &(sigdata->redeem_script).super_CScriptBase);
      in_RDX = extraout_RDX;
    }
  }
  uVar1 = (this->witness_script).super_CScriptBase._size;
  uVar7 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar7 = uVar1;
  }
  if (uVar7 == 0) {
    uVar1 = (sigdata->witness_script).super_CScriptBase._size;
    uVar7 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar7 = uVar1;
    }
    if (uVar7 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(this->witness_script).super_CScriptBase,
                 &(sigdata->witness_script).super_CScriptBase);
      in_RDX = extraout_RDX_00;
    }
  }
  auVar9._8_8_ = in_RDX;
  auVar9._0_8_ = (sigdata->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var8 = auVar9._0_8_,
        (_Rb_tree_header *)p_Var8 != &(sigdata->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
    ::_M_emplace_unique<std::pair<CPubKey,KeyOriginInfo>const&>
              ((pair<std::_Rb_tree_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>,_bool> *)
               &this->hd_keypaths,
               (_Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
                *)&p_Var8[1]._M_right,auVar9._8_8_);
    auVar9 = std::_Rb_tree_increment(p_Var8);
  }
  bVar5 = base_blob<256U>::IsNull((base_blob<256U> *)&sigdata->tr_spenddata);
  if (!bVar5) {
    uVar2 = *(undefined8 *)
             (sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems;
    uVar3 = *(undefined8 *)
             ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
             8);
    uVar4 = *(undefined8 *)
             ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
             0x18);
    *(undefined8 *)
     ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)
          ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
          0x10);
    *(undefined8 *)
     ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar4;
    *(undefined8 *)(this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
         uVar2;
    *(undefined8 *)((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8)
         = uVar3;
  }
  if (((sigdata->tr_builder).super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
       super__Optional_payload<TaprootBuilder,_true,_false,_false>.
       super__Optional_payload_base<TaprootBuilder>._M_engaged == true) &&
     (*(pointer *)
       &(sigdata->tr_builder).super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
        super__Optional_payload<TaprootBuilder,_true,_false,_false>.
        super__Optional_payload_base<TaprootBuilder>._M_payload._M_value.m_branch.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      != *(pointer *)
          ((long)&(sigdata->tr_builder).super__Optional_base<TaprootBuilder,_false,_false>.
                  _M_payload.super__Optional_payload<TaprootBuilder,_true,_false,_false>.
                  super__Optional_payload_base<TaprootBuilder>._M_payload._M_value.m_branch + 8))) {
    TaprootBuilder::GetTreeTuples(&vStack_48,(TaprootBuilder *)&sigdata->tr_builder);
    std::
    vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::_M_move_assign(&this->m_tap_tree,&vStack_48);
    std::
    vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~vector(&vStack_48);
  }
  for (p_Var6 = (sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var6 !=
        &(sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
    std::
    _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
    ::
    _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
              ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                *)&this->m_tap_bip32_paths,(XOnlyPubKey *)(p_Var6 + 1),
               (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                *)(p_Var6 + 2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PSBTOutput::FromSignatureData(const SignatureData& sigdata)
{
    if (redeem_script.empty() && !sigdata.redeem_script.empty()) {
        redeem_script = sigdata.redeem_script;
    }
    if (witness_script.empty() && !sigdata.witness_script.empty()) {
        witness_script = sigdata.witness_script;
    }
    for (const auto& entry : sigdata.misc_pubkeys) {
        hd_keypaths.emplace(entry.second);
    }
    if (!sigdata.tr_spenddata.internal_key.IsNull()) {
        m_tap_internal_key = sigdata.tr_spenddata.internal_key;
    }
    if (sigdata.tr_builder.has_value() && sigdata.tr_builder->HasScripts()) {
        m_tap_tree = sigdata.tr_builder->GetTreeTuples();
    }
    for (const auto& [pubkey, leaf_origin] : sigdata.taproot_misc_pubkeys) {
        m_tap_bip32_paths.emplace(pubkey, leaf_origin);
    }
}